

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::PrintFileRuntimePreamble
          (FileGenerator *this,Printer *printer,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *headers_to_import)

{
  io::Printer::Print<char[9],std::__cxx11::string>
            (printer,
             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
             ,(char (*) [9])"filename",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this->file_);
  ImportWriter::PrintRuntimeImports
            (printer,headers_to_import,&(this->options_).runtime_import_prefix,true);
  io::Printer::Print<>(printer,"\n");
  return;
}

Assistant:

void FileGenerator::PrintFileRuntimePreamble(
    io::Printer* printer,
    const std::vector<std::string>& headers_to_import) const {
  printer->Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n",
      "filename", file_->name());
  ImportWriter::PrintRuntimeImports(
      printer, headers_to_import, options_.runtime_import_prefix, true);
  printer->Print("\n");
}